

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

int Abc_SclComputeReverseLevel(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(pObj->vFanouts).nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    uVar1 = 0;
    do {
      uVar2 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]] + 0x14) >>
              0xc;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return uVar1 + 1;
  }
  return 1;
}

Assistant:

int Abc_SclComputeReverseLevel( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Level = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Level = Abc_MaxInt( Level, pFanout->Level );
    return Level + 1;
}